

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<Symbol> * __thiscall QList<Symbol>::operator+=(QList<Symbol> *this,QList<Symbol> *l)

{
  long n;
  Data *pDVar1;
  Symbol *pSVar2;
  
  n = (l->d).size;
  if (n != 0) {
    pDVar1 = (l->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pSVar2 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<Symbol>::growAppend
                ((QCommonArrayOps<Symbol> *)this,pSVar2,pSVar2 + n);
    }
    else {
      QArrayDataPointer<Symbol>::detachAndGrow
                (&this->d,GrowsAtEnd,n,(Symbol **)0x0,(QArrayDataPointer<Symbol> *)0x0);
      pSVar2 = (l->d).ptr;
      QtPrivate::QGenericArrayOps<Symbol>::moveAppend
                ((QGenericArrayOps<Symbol> *)this,pSVar2,pSVar2 + (l->d).size);
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }